

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  code *pcVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint *in_RCX;
  byte *in_RDX;
  byte *p;
  byte *in_RSI;
  uint8_t **in_RDI;
  ptls_iovec_t pVar7;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  st_ptls_extension_bitmap_t bitmap;
  uint16_t type;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  size_t num_certs;
  ptls_iovec_t certs [16];
  uint8_t *in_stack_fffffffffffffda8;
  uint8_t **in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb8;
  uint16_t in_stack_fffffffffffffdbe;
  uint8_t *local_230;
  size_t local_228;
  ulong local_208;
  long local_200;
  undefined8 in_stack_fffffffffffffe18;
  st_ptls_extension_bitmap_t *in_stack_fffffffffffffe20;
  long local_1d8;
  st_ptls_extension_bitmap_t local_1ca;
  uint16_t local_1c2;
  ptls_iovec_t local_1c0;
  byte *local_1b0;
  ulong local_198;
  long local_190;
  byte *local_188;
  ulong local_170;
  long local_168;
  byte *local_160;
  ulong local_148;
  long local_140;
  uint local_134;
  ulong local_130;
  size_t local_128 [33];
  uint *local_20;
  byte *local_18;
  byte *local_10;
  uint8_t **local_8;
  
  local_140 = 1;
  if (in_RDX == in_RSI) {
    local_134 = 0x32;
  }
  else {
    local_148 = 0;
    local_10 = in_RSI;
    do {
      pbVar5 = local_10 + 1;
      local_148 = local_148 << 8 | (ulong)*local_10;
      local_140 = local_140 + -1;
      local_10 = pbVar5;
    } while (local_140 != 0);
    if ((ulong)((long)in_RDX - (long)pbVar5) < local_148) {
      local_134 = 0x32;
    }
    else {
      local_160 = pbVar5 + local_148;
      if (pbVar5 == local_160) {
        if (pbVar5 == local_160) {
          local_168 = 3;
          if ((ulong)((long)in_RDX - (long)pbVar5) < 3) {
            local_134 = 0x32;
          }
          else {
            local_170 = 0;
            do {
              local_188 = local_10 + 1;
              local_170 = local_170 << 8 | (ulong)*local_10;
              local_168 = local_168 + -1;
              local_10 = local_188;
            } while (local_168 != 0);
            local_130 = 0;
            local_134 = 0;
            if ((ulong)((long)in_RDX - (long)local_188) < local_170) {
              local_134 = 0x32;
            }
            else {
              local_188 = local_188 + local_170;
              local_140 = 0;
              local_168 = 0;
              local_20 = in_RCX;
              local_18 = in_RDX;
              local_8 = in_RDI;
              do {
                uVar3 = local_130;
                if (local_10 == local_188) {
                  if (local_10 != local_188) {
                    return 0x32;
                  }
                  if (local_10 != local_18) {
                    return 0x32;
                  }
                  if (((local_130 != 0) && (*(long *)(*local_8 + 0x50) != 0)) &&
                     (local_134 = (*(code *)**(undefined8 **)(*local_8 + 0x50))
                                            (*(undefined8 *)(*local_8 + 0x50),local_8,local_8 + 0x3c
                                             ,local_8 + 0x3d,local_128,local_130), local_134 != 0))
                  {
                    return local_134;
                  }
                  *local_20 = (uint)(local_130 != 0);
                  return local_134;
                }
                local_190 = 3;
                if ((ulong)((long)local_188 - (long)local_10) < 3) {
                  return 0x32;
                }
                local_198 = 0;
                do {
                  pbVar5 = local_10 + 1;
                  local_198 = local_198 << 8 | (ulong)*local_10;
                  local_190 = local_190 + -1;
                  local_10 = pbVar5;
                } while (local_190 != 0);
                if ((ulong)((long)local_188 - (long)pbVar5) < local_198) {
                  return 0x32;
                }
                local_1b0 = pbVar5 + local_198;
                if (local_130 < 0x10) {
                  lVar2 = local_130 * 2;
                  local_130 = local_130 + 1;
                  local_1c0 = ptls_iovec_init(pbVar5,(long)local_1b0 - (long)pbVar5);
                  local_128[lVar2] = (size_t)local_1c0.base;
                  local_128[uVar3 * 2 + 1] = local_1c0.len;
                }
                local_10 = local_1b0;
                init_extension_bitmap
                          (in_stack_fffffffffffffe20,
                           (uint8_t)((ulong)in_stack_fffffffffffffe18 >> 0x38));
                local_1d8 = 2;
                if ((ulong)((long)local_188 - (long)local_10) < 2) {
                  return 0x32;
                }
                in_stack_fffffffffffffe20 = (st_ptls_extension_bitmap_t *)0x0;
                do {
                  pbVar5 = local_10 + 1;
                  in_stack_fffffffffffffe20 =
                       (st_ptls_extension_bitmap_t *)
                       ((long)in_stack_fffffffffffffe20 << 8 | (ulong)*local_10);
                  local_1d8 = local_1d8 + -1;
                  local_10 = pbVar5;
                } while (local_1d8 != 0);
                if ((st_ptls_extension_bitmap_t *)(local_188 + -(long)pbVar5) <
                    in_stack_fffffffffffffe20) {
                  return 0x32;
                }
                pbVar5 = pbVar5 + (long)in_stack_fffffffffffffe20;
                while (local_10 != pbVar5) {
                  local_134 = ptls_decode16((uint16_t *)
                                            CONCAT26(in_stack_fffffffffffffdbe,
                                                     in_stack_fffffffffffffdb8),
                                            in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
                  if (local_134 != 0) {
                    return local_134;
                  }
                  iVar4 = extension_bitmap_is_set(&local_1ca,local_1c2);
                  if (iVar4 != 0) {
                    return 0x2f;
                  }
                  extension_bitmap_set(&local_1ca,local_1c2);
                  local_200 = 2;
                  if ((ulong)((long)pbVar5 - (long)local_10) < 2) {
                    return 0x32;
                  }
                  local_208 = 0;
                  do {
                    p = local_10 + 1;
                    local_208 = local_208 << 8 | (ulong)*local_10;
                    local_200 = local_200 + -1;
                    local_10 = p;
                  } while (local_200 != 0);
                  if ((ulong)((long)pbVar5 - (long)p) < local_208) {
                    return 0x32;
                  }
                  pbVar6 = p + local_208;
                  local_10 = pbVar6;
                  if (*(long *)(*local_8 + 0xb0) != 0) {
                    pcVar1 = (code *)**(undefined8 **)(*local_8 + 0xb0);
                    in_stack_fffffffffffffda8 = *(uint8_t **)(*local_8 + 0xb0);
                    in_stack_fffffffffffffdb0 = local_8;
                    in_stack_fffffffffffffdbe = local_1c2;
                    local_10 = p;
                    pVar7 = ptls_iovec_init(p,(long)pbVar6 - (long)p);
                    local_230 = pVar7.base;
                    local_228 = pVar7.len;
                    iVar4 = (*pcVar1)(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0,0xb,
                                      in_stack_fffffffffffffdbe,local_230,local_228);
                    local_134 = (uint)(iVar4 != 0);
                    local_10 = pbVar6;
                    if (iVar4 != 0) {
                      return local_134;
                    }
                  }
                }
              } while (local_10 == pbVar5);
              local_134 = 0x32;
            }
          }
        }
        else {
          local_134 = 0x32;
        }
      }
      else {
        local_134 = 0x2f;
      }
    }
  }
  return local_134;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < PTLS_ELEMENTSOF(certs))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (num_certs != 0 && tls->ctx->verify_certificate != NULL) {
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}